

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tok_write_defines(tokcxdef *ctx,osfildef *fp,errcxdef *ec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  int iVar4;
  tokdfdef *ptVar5;
  tokdfdef **pptVar6;
  undefined1 auVar7 [16];
  undefined1 local_34 [4];
  
  pptVar6 = ctx->tokcxdf;
  iVar4 = 0x40;
  while( true ) {
    for (ptVar5 = *pptVar6; ptVar5 != (tokdfdef *)0x0; ptVar5 = ptVar5->nxt) {
      uVar1 = ptVar5->len;
      uVar2 = ptVar5->explen;
      auVar7._4_4_ = uVar2;
      auVar7._0_4_ = uVar1;
      auVar7._8_8_ = 0;
      pshuflw(auVar7,auVar7,0xe8);
      sVar3 = fwrite(local_34,4,1,(FILE *)fp);
      if (sVar3 != 1) goto LAB_00115a43;
      sVar3 = fwrite(ptVar5->nm,(long)ptVar5->len,1,(FILE *)fp);
      if (sVar3 != 1) goto LAB_00115a43;
      if ((long)ptVar5->explen != 0) {
        sVar3 = fwrite(ptVar5->expan,(long)ptVar5->explen,1,(FILE *)fp);
        if (sVar3 != 1) goto LAB_00115a43;
      }
    }
    sVar3 = fwrite(local_34,4,1,(FILE *)fp);
    if (sVar3 != 1) break;
    pptVar6 = pptVar6 + 1;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return;
    }
  }
LAB_00115a43:
  errsigf(ec,"TADS",0x259);
}

Assistant:

void tok_write_defines(tokcxdef *ctx, osfildef *fp, errcxdef *ec)
{
    int        i;
    tokdfdef **dfp;
    tokdfdef  *df;
    char       buf[4];

    /* write each element of the hash chains */
    for (i = TOKDFHSHSIZ, dfp = ctx->tokcxdf ; i ; ++dfp, --i)
    {
        /* write each entry in this hash chain */
        for (df = *dfp ; df ; df = df->nxt)
        {
            /* write this entry */
            oswp2(buf, df->len);
            oswp2(buf + 2, df->explen);
            if (osfwb(fp, buf, 4)
                || osfwb(fp, df->nm, df->len)
                || (df->explen != 0 && osfwb(fp, df->expan, df->explen)))
                errsig(ec, ERR_WRTGAM);
        }

        /* write a zero-length entry to indicate the end of this chain */
        oswp2(buf, 0);
        if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
    }
}